

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::Encode
          (IntercomCommunicationParameters *this,KDataStream *stream)

{
  DataTypeBase *pDVar1;
  
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Type);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Length);
  pDVar1 = this->m_pRecord;
  if (pDVar1 != (DataTypeBase *)0x0) {
    (*pDVar1->_vptr_DataTypeBase[5])(pDVar1,stream);
    return;
  }
  return;
}

Assistant:

void IntercomCommunicationParameters::Encode( KDataStream & stream ) const
{
    stream << m_ui16Type
           << m_ui16Length;

    if( m_pRecord )
        m_pRecord->Encode( stream );
}